

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

bool __thiscall
soul::HTMLGenerator::replaceTemplatePlaceholder
          (HTMLGenerator *this,CompileMessageList *errors,string *templateCode,string *placeholder,
          string *replacement)

{
  string_view firstReplacement;
  bool bVar1;
  string *this_00;
  string_view s;
  string_view t;
  string_view firstToReplace;
  Ptr in_stack_ffffffffffffff88;
  UTF8Reader in_stack_ffffffffffffff90;
  string local_68;
  string local_48;
  
  s._M_str = (placeholder->_M_dataplus)._M_p;
  s._M_len = placeholder->_M_string_length;
  t._M_str = (templateCode->_M_dataplus)._M_p;
  t._M_len = templateCode->_M_string_length;
  bVar1 = choc::text::contains(t,s);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_48,(string *)templateCode);
    firstReplacement._M_str = in_stack_ffffffffffffff90.data;
    firstReplacement._M_len = (size_t)in_stack_ffffffffffffff88.object;
    firstToReplace._M_str = (char *)replacement->_M_string_length;
    firstToReplace._M_len = (size_t)(placeholder->_M_dataplus)._M_p;
    choc::text::replace<std::__cxx11::string>
              (&local_68,(text *)&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               placeholder->_M_string_length,firstToReplace,firstReplacement);
    std::__cxx11::string::operator=((string *)templateCode,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    this_00 = &local_48;
  }
  else {
    std::operator+(&local_68,"Template doesn\'t contain placeholder ",placeholder);
    CompileMessageList::addError(errors,&local_68,(CodeLocation *)&stack0xffffffffffffff88);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&stack0xffffffffffffff88);
    this_00 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_00);
  return bVar1;
}

Assistant:

bool replaceTemplatePlaceholder (soul::CompileMessageList& errors,
                                     std::string& templateCode,
                                     const std::string& placeholder,
                                     const std::string& replacement)
    {
        if (! choc::text::contains (templateCode, placeholder))
        {
            errors.addError ("Template doesn't contain placeholder " + placeholder, {});
            return false;
        }

        templateCode = choc::text::replace (templateCode, placeholder, replacement);
        return true;
    }